

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::Destruct
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this)

{
  bool bVar1;
  Char *Message;
  IMemoryAllocator *pIVar2;
  uint local_40;
  Uint32 i;
  undefined1 local_30 [8];
  string msg;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->m_IsDestructed & 1U) != 0) {
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"This object has already been destructed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1c7);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc);
  if ((bVar1) && ((this->field_6).m_pGraphicsPipelineData != (GraphicsPipelineData *)0x0)) {
    GraphicsPipelineData::~GraphicsPipelineData((this->field_6).m_pGraphicsPipelineData);
  }
  else {
    bVar1 = PipelineStateDesc::IsRayTracingPipeline
                      (&(this->
                        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                        ).m_Desc);
    if ((bVar1) && ((this->field_6).m_pGraphicsPipelineData != (GraphicsPipelineData *)0x0)) {
      RayTracingPipelineData::~RayTracingPipelineData((this->field_6).m_pRayTracingPipelineData);
    }
    else {
      PipelineStateDesc::IsTilePipeline
                (&(this->
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  ).m_Desc);
    }
  }
  if (this->m_Signatures != (SignatureAutoPtrType *)0x0) {
    for (local_40 = 0; local_40 < this->m_SignatureCount; local_40 = local_40 + 1) {
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::~RefCntAutoPtr
                (this->m_Signatures + local_40);
    }
    this->m_Signatures = (SignatureAutoPtrType *)0x0;
  }
  if ((this->field_6).m_pGraphicsPipelineData != (GraphicsPipelineData *)0x0) {
    pIVar2 = GetRawAllocator();
    (*pIVar2->_vptr_IMemoryAllocator[1])(pIVar2,(this->field_6).m_pGraphicsPipelineData);
    (this->field_6).m_pGraphicsPipelineData = (GraphicsPipelineData *)0x0;
  }
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        if (this->m_Desc.IsAnyGraphicsPipeline() && m_pGraphicsPipelineData != nullptr)
        {
            m_pGraphicsPipelineData->~GraphicsPipelineData();
        }
        else if (this->m_Desc.IsRayTracingPipeline() && m_pRayTracingPipelineData != nullptr)
        {
            m_pRayTracingPipelineData->~RayTracingPipelineData();
        }
        else if (this->m_Desc.IsTilePipeline() && m_pTilePipelineData != nullptr)
        {
            m_pTilePipelineData->~TilePipelineData();
        }

        if (m_Signatures != nullptr)
        {
            for (Uint32 i = 0; i < m_SignatureCount; ++i)
                m_Signatures[i].~SignatureAutoPtrType();
            m_Signatures = nullptr;
        }

        if (m_pPipelineDataRawMem)
        {
            GetRawAllocator().Free(m_pPipelineDataRawMem);
            m_pPipelineDataRawMem = nullptr;
        }
#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }